

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O0

Face * __thiscall HalfMesh::Mesh::get_face(Mesh *this,uint i)

{
  bool bVar1;
  mapped_type *ppFVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_HalfMesh::Face_*>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_HalfMesh::Face_*>,_false> local_30;
  Mesh *local_28;
  Face *new_face;
  Mesh *pMStack_18;
  uint i_local;
  Mesh *this_local;
  
  local_28 = (Mesh *)0x0;
  new_face._4_4_ = i;
  pMStack_18 = this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_HalfMesh::Face_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_HalfMesh::Face_*>_>_>
       ::find(&this->face_handle_to_face_map,(key_type *)((long)&new_face + 4));
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_HalfMesh::Face_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_HalfMesh::Face_*>_>_>
       ::end(&this->face_handle_to_face_map);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    ppFVar2 = std::
              unordered_map<unsigned_int,_HalfMesh::Face_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_HalfMesh::Face_*>_>_>
              ::operator[](&this->face_handle_to_face_map,(key_type *)((long)&new_face + 4));
    this_local = (Mesh *)*ppFVar2;
  }
  else {
    this_local = local_28;
  }
  return (Face *)this_local;
}

Assistant:

Face *get_face(unsigned int i) {
            Face *new_face = NULL_FACE;
            if (face_handle_to_face_map.find(i) != face_handle_to_face_map.end()) {
                return face_handle_to_face_map[i];
            } else {
                return new_face;
            }
        }